

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_Texture::IsTiled(ON_Texture *this,int dir,double *count,double *offset)

{
  double dVar1;
  byte bVar2;
  ulong uVar3;
  ON_Xform *pOVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  if (count != (double *)0x0) {
    *count = 1.0;
  }
  if (offset != (double *)0x0) {
    *offset = 0.0;
  }
  if ((uint)dir < 4) {
    pOVar4 = &this->m_uvw;
    uVar3 = (ulong)(uint)dir;
    uVar5 = 0xffffffff;
    lVar6 = 0;
    do {
      uVar7 = 0;
      do {
        if ((uVar3 != uVar7) && ((dVar1 = pOVar4->m_xform[0][uVar7], dVar1 != 0.0 || (NAN(dVar1)))))
        goto LAB_004dea53;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
      uVar7 = 3;
LAB_004dea53:
      if ((int)uVar7 == 3) {
        bVar8 = uVar5 != 0xffffffff;
        uVar5 = (uint)lVar6;
        if (bVar8) {
          uVar3 = 0;
          goto LAB_004deaad;
        }
      }
      lVar6 = lVar6 + 1;
      pOVar4 = (ON_Xform *)(pOVar4->m_xform + 1);
    } while (lVar6 != 3);
    if ((int)uVar5 < 0) {
      bVar8 = true;
    }
    else {
      if (count != (double *)0x0) {
        *count = (this->m_uvw).m_xform[uVar5][uVar3];
      }
      uVar3 = 1;
      if (offset != (double *)0x0) {
        *offset = (this->m_uvw).m_xform[uVar5][3];
      }
LAB_004deaad:
      bVar8 = false;
    }
    bVar2 = (byte)uVar3;
    if (!bVar8) goto LAB_004deab9;
  }
  bVar2 = 0;
LAB_004deab9:
  return (bool)(bVar2 & 1);
}

Assistant:

bool ON_Texture::IsTiled( int dir, double* count, double* offset ) const
{
  if ( count )
    *count = 1.0;
  if ( offset )
    *offset = 0.0;

  if ( 0 <= dir && dir <= 3 )
  {
    int row0=-1, row, col;
    for ( row = 0; row < 3; row++ )
    {
      for ( col = 0; col < 3; col++ )
      {
        if ( col != dir && 0.0 != m_uvw.m_xform[row][col] )
          break;
      }
      if ( 3 == col )
      {
        if ( -1 == row0 )
        {
          row0 = row;
        }
        else
          return false;
      }
    }
    if ( row0 >= 0 )
    {
      if (count)
        *count = m_uvw.m_xform[row0][dir];
      if ( offset )
        *offset = m_uvw.m_xform[row0][3];
      return true;
    }
  }

  return false;
}